

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_h_predictor_16x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  undefined1 (*pauVar4) [16];
  undefined8 *puVar5;
  long lVar6;
  undefined1 (*pauVar7) [16];
  undefined8 *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar18 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  lVar1 = stride * 4;
  iVar3 = 0;
  do {
    auVar17 = *(undefined1 (*) [16])left;
    auVar16._0_14_ = auVar17._0_14_;
    auVar16[0xe] = auVar17[7];
    auVar16[0xf] = auVar17[7];
    auVar15._14_2_ = auVar16._14_2_;
    auVar15._0_13_ = auVar17._0_13_;
    auVar15[0xd] = auVar17[6];
    auVar14._13_3_ = auVar15._13_3_;
    auVar14._0_12_ = auVar17._0_12_;
    auVar14[0xc] = auVar17[6];
    auVar13._12_4_ = auVar14._12_4_;
    auVar13._0_11_ = auVar17._0_11_;
    auVar13[0xb] = auVar17[5];
    auVar18._11_5_ = auVar13._11_5_;
    auVar18._0_10_ = auVar17._0_10_;
    auVar18[10] = auVar17[5];
    auVar12._10_6_ = auVar18._10_6_;
    auVar12._0_9_ = auVar17._0_9_;
    auVar12[9] = auVar17[4];
    auVar11._9_7_ = auVar12._9_7_;
    auVar11._0_8_ = auVar17._0_8_;
    auVar11[8] = auVar17[4];
    auVar10._8_8_ = auVar11._8_8_;
    auVar10[7] = auVar17[3];
    auVar10[6] = auVar17[3];
    auVar10[5] = auVar17[2];
    auVar10[4] = auVar17[2];
    auVar10[3] = auVar17[1];
    auVar10[2] = auVar17[1];
    auVar10[1] = auVar17[0];
    auVar10[0] = auVar17[0];
    auVar18 = pshuflw(in_XMM2,auVar10,0);
    local_48._0_4_ = auVar18._0_4_;
    local_48._4_4_ = local_48._0_4_;
    local_48._8_4_ = local_48._0_4_;
    local_48._12_4_ = local_48._0_4_;
    auVar18 = pshuflw(local_48,auVar10,0x55);
    local_38._0_4_ = auVar18._0_4_;
    local_38._4_4_ = local_38._0_4_;
    local_38._8_4_ = local_38._0_4_;
    local_38._12_4_ = local_38._0_4_;
    auVar18 = pshuflw(local_38,auVar10,0xaa);
    local_28._0_4_ = auVar18._0_4_;
    local_28._4_4_ = local_28._0_4_;
    local_28._8_4_ = local_28._0_4_;
    local_28._12_4_ = local_28._0_4_;
    auVar18 = pshuflw(local_28,auVar10,0xff);
    local_18 = auVar18._0_4_;
    uStack_14 = local_18;
    uStack_10 = local_18;
    uStack_c = local_18;
    lVar6 = 0;
    pauVar7 = (undefined1 (*) [16])dst;
    do {
      auVar18 = *(undefined1 (*) [16])(local_48 + lVar6);
      *pauVar7 = auVar18;
      pauVar7 = (undefined1 (*) [16])(*pauVar7 + stride);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    auVar18 = pshufhw(auVar18,auVar10,0);
    local_48._8_4_ = auVar18._8_4_;
    local_48._4_4_ = local_48._8_4_;
    local_48._0_4_ = local_48._8_4_;
    local_48._12_4_ = local_48._8_4_;
    auVar18 = pshufhw(local_48,auVar10,0x55);
    local_38._8_4_ = auVar18._8_4_;
    local_38._4_4_ = local_38._8_4_;
    local_38._0_4_ = local_38._8_4_;
    local_38._12_4_ = local_38._8_4_;
    auVar18 = pshufhw(local_38,auVar10,0xaa);
    in_XMM2._8_4_ = auVar18._8_4_;
    in_XMM2._4_4_ = in_XMM2._8_4_;
    in_XMM2._0_4_ = in_XMM2._8_4_;
    in_XMM2._12_4_ = in_XMM2._8_4_;
    local_28 = in_XMM2;
    auVar18 = pshufhw(auVar10,auVar10,0xff);
    local_18 = auVar18._8_4_;
    uStack_14 = local_18;
    uStack_10 = local_18;
    uStack_c = local_18;
    lVar6 = 0;
    pauVar7 = (undefined1 (*) [16])(*(undefined1 (*) [16])dst + lVar1);
    do {
      auVar18 = *(undefined1 (*) [16])(local_48 + lVar6);
      *pauVar7 = auVar18;
      pauVar7 = (undefined1 (*) [16])(*pauVar7 + stride);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    pauVar4 = (undefined1 (*) [16])
              (*(undefined1 (*) [16])(*(undefined1 (*) [16])dst + lVar1) + lVar1);
    auVar9[1] = auVar17[8];
    auVar9[0] = auVar17[8];
    auVar9[2] = auVar17[9];
    auVar9[3] = auVar17[9];
    auVar9[4] = auVar17[10];
    auVar9[5] = auVar17[10];
    auVar9[6] = auVar17[0xb];
    auVar9[7] = auVar17[0xb];
    auVar9[8] = auVar17[0xc];
    auVar9[9] = auVar17[0xc];
    auVar9[10] = auVar17[0xd];
    auVar9[0xb] = auVar17[0xd];
    auVar9[0xc] = auVar17[0xe];
    auVar9[0xd] = auVar17[0xe];
    auVar9[0xf] = auVar17[0xf];
    auVar9[0xe] = auVar9[0xf];
    auVar17 = pshuflw(auVar18,auVar9,0);
    local_48._0_4_ = auVar17._0_4_;
    local_48._4_4_ = local_48._0_4_;
    local_48._8_4_ = local_48._0_4_;
    local_48._12_4_ = local_48._0_4_;
    auVar17 = pshuflw(local_48,auVar9,0x55);
    local_38._0_4_ = auVar17._0_4_;
    local_38._4_4_ = local_38._0_4_;
    local_38._8_4_ = local_38._0_4_;
    local_38._12_4_ = local_38._0_4_;
    auVar17 = pshuflw(local_38,auVar9,0xaa);
    local_28._0_4_ = auVar17._0_4_;
    local_28._4_4_ = local_28._0_4_;
    local_28._8_4_ = local_28._0_4_;
    local_28._12_4_ = local_28._0_4_;
    auVar17 = pshuflw(local_28,auVar9,0xff);
    local_18 = auVar17._0_4_;
    uStack_14 = local_18;
    uStack_10 = local_18;
    uStack_c = local_18;
    lVar6 = 0;
    pauVar7 = pauVar4;
    do {
      auVar17 = *(undefined1 (*) [16])(local_48 + lVar6);
      *pauVar7 = auVar17;
      pauVar7 = (undefined1 (*) [16])(*pauVar7 + stride);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    puVar5 = (undefined8 *)(*pauVar4 + lVar1);
    auVar17 = pshufhw(auVar17,auVar9,0);
    local_48._8_4_ = auVar17._8_4_;
    local_48._4_4_ = local_48._8_4_;
    local_48._0_4_ = local_48._8_4_;
    local_48._12_4_ = local_48._8_4_;
    auVar17 = pshufhw(local_48,auVar9,0x55);
    local_38._8_4_ = auVar17._8_4_;
    local_38._4_4_ = local_38._8_4_;
    local_38._0_4_ = local_38._8_4_;
    local_38._12_4_ = local_38._8_4_;
    auVar17 = pshufhw(local_38,auVar9,0xaa);
    local_28._4_4_ = auVar17._8_4_;
    local_28._0_4_ = local_28._4_4_;
    local_28._8_4_ = local_28._4_4_;
    local_28._12_4_ = local_28._4_4_;
    auVar17 = pshufhw(auVar9,auVar9,0xff);
    local_18 = auVar17._8_4_;
    uStack_14 = local_18;
    uStack_10 = local_18;
    uStack_c = local_18;
    lVar6 = 0;
    puVar8 = puVar5;
    do {
      uVar2 = *(undefined8 *)(local_48 + lVar6 + 8);
      *puVar8 = *(undefined8 *)(local_48 + lVar6);
      puVar8[1] = uVar2;
      puVar8 = (undefined8 *)((long)puVar8 + stride);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    dst = (uint8_t *)((long)puVar5 + lVar1);
    left = (uint8_t *)((long)left + 0x10);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 2);
  return;
}

Assistant:

void aom_h_predictor_16x32_sse2(uint8_t *dst, ptrdiff_t stride,
                                const uint8_t *above, const uint8_t *left) {
  (void)above;
  h_predictor_16xh(dst, stride, left, 2);
}